

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_ZONE(effect_handler_context_t *context)

{
  wchar_t typ;
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t dam;
  wchar_t wVar3;
  loc_conflict lVar4;
  wchar_t wVar5;
  loc finish;
  wchar_t wVar6;
  ulong uVar7;
  source sVar8;
  source origin;
  
  lVar4.y = 0;
  lVar4.x = (player->grid).x;
  uVar7 = (ulong)(uint)(player->grid).y;
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  typ = context->subtype;
  wVar1 = context->radius;
  wVar2 = context->other;
  if ((context->x != L'\0') && (context->y != L'\0')) {
    lVar4 = loc(context->x,context->y);
    uVar7 = (ulong)lVar4 >> 0x20;
  }
  for (wVar5 = (int)uVar7 - wVar1; wVar6 = lVar4.x - wVar1, wVar5 <= (int)uVar7 + wVar1;
      wVar5 = wVar5 + L'\x01') {
    for (; wVar6 <= lVar4.x + wVar1; wVar6 = wVar6 + L'\x01') {
      finish.y = wVar5;
      finish.x = wVar6;
      wVar3 = distance((loc_conflict)((ulong)lVar4 & 0xffffffff | uVar7 << 0x20),
                       (loc_conflict)finish);
      if ((wVar3 <= wVar1) && (wVar3 = Rand_div(100), wVar3 < wVar2)) {
        sVar8 = source_player();
        origin._4_4_ = 0;
        origin.what = sVar8.what;
        origin.which.trap = sVar8.which.trap;
        project(origin,L'\x01',finish,dam,typ,L'y',L'\0','\0',(object *)0x0);
      }
    }
  }
  return true;
}

Assistant:

bool effect_handler_ZONE(effect_handler_context_t *context)
{
	struct loc grid, centre = player->grid;
	int dam = effect_calculate_value(context, false);
	int rad = context->radius;
	int type = context->subtype;
	int chance = context->other;
	int flg = PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL |
		PROJECT_JUMP;

	/* Check for coordinates */
	if (context->x && context->y) {
		centre = loc(context->x, context->y);
	}

	/* Everything in range */
	for (grid.y = centre.y - rad; grid.y <= centre.y + rad; grid.y++) {
		for (grid.x = centre.x - rad; grid.x <= centre.x + rad; grid.x++) {
			int dist = distance(centre, grid);

			/* Skip distant grids */
			if (dist > rad) continue;

			/* Percentage chance of hitting */
			if (randint0(100) >= chance) continue;

			project(source_player(), 1, grid, dam, type, flg, 0, 0, NULL);
		}
	}
	return true;
}